

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

bool __thiscall
ON_SubDComponentFilter::AcceptComponent(ON_SubDComponentFilter *this,ON_SubDComponentPtr cptr)

{
  bool bVar1;
  
  switch((uint)cptr.m_ptr & 6) {
  case 0:
    return false;
  case 2:
    bVar1 = AcceptVertex(this,(ON_SubDVertex *)(cptr.m_ptr & 0xfffffffffffffff8));
    return bVar1;
  case 4:
    bVar1 = AcceptEdge(this,(ON_SubDEdge *)(cptr.m_ptr & 0xfffffffffffffff8));
    return bVar1;
  case 6:
    bVar1 = AcceptFace(this,(ON_SubDFace *)(cptr.m_ptr & 0xfffffffffffffff8));
    return bVar1;
  }
}

Assistant:

ON_SubDComponentPtr::Type ON_SubDComponentPtr::ComponentType() const
{
  switch (ON_SUBD_COMPONENT_TYPE_MASK & m_ptr)
  {
  case ON_SUBD_COMPONENT_TYPE_VERTEX:
    return ON_SubDComponentPtr::Type::Vertex;
  case ON_SUBD_COMPONENT_TYPE_EDGE:
    return ON_SubDComponentPtr::Type::Edge;
  case ON_SUBD_COMPONENT_TYPE_FACE:
    return ON_SubDComponentPtr::Type::Face;
  }
  return ON_SubDComponentPtr::Type::Unset;
}